

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void Memory::
     DeleteObject<Memory::Recycler,(Memory::AllocatorDeleteFlags)0,JsUtil::ReadOnlyList<unsigned_int,Memory::Recycler,DefaultComparer>>
               (AllocatorType *allocator,
               ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *obj)

{
  (*obj->_vptr_ReadOnlyList[2])(obj);
  Recycler::ExplicitFreeNonLeaf(allocator,obj,0x20);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}